

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_doing(Curl_easy *data,_Bool *dophase_done)

{
  ftpstate fVar1;
  connectdata *pcVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  char *pcVar5;
  char *fmt;
  
  pcVar2 = data->conn;
  CVar4 = Curl_pp_statemach(data,&(pcVar2->proto).ftpc.pp,false,false);
  fVar1 = (pcVar2->proto).ftpc.state;
  *dophase_done = fVar1 == '\0';
  if (CVar4 == CURLE_OK) {
    if (fVar1 != '\0') {
      return CURLE_OK;
    }
    CVar4 = ftp_dophase_done(data,false);
    if (data == (Curl_easy *)0x0) {
      return CVar4;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return CVar4;
    }
    pcVar3 = (data->state).feat;
    if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
      return CVar4;
    }
    if (Curl_trc_feat_ftp.log_level < 1) {
      return CVar4;
    }
    if (data->conn == (connectdata *)0x0) {
      pcVar5 = "???";
    }
    else {
      pcVar5 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    fmt = "[%s] DO phase is complete2";
  }
  else {
    if (data == (Curl_easy *)0x0) {
      return CVar4;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return CVar4;
    }
    pcVar3 = (data->state).feat;
    if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
      return CVar4;
    }
    if (Curl_trc_feat_ftp.log_level < 1) {
      return CVar4;
    }
    if (data->conn == (connectdata *)0x0) {
      pcVar5 = "???";
    }
    else {
      pcVar5 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    fmt = "[%s] DO phase failed";
  }
  Curl_trc_ftp(data,fmt,pcVar5);
  return CVar4;
}

Assistant:

static CURLcode ftp_doing(struct Curl_easy *data,
                          bool *dophase_done)
{
  CURLcode result = ftp_multi_statemach(data, dophase_done);

  if(result)
    CURL_TRC_FTP(data, "[%s] DO phase failed", FTP_DSTATE(data));
  else if(*dophase_done) {
    result = ftp_dophase_done(data, FALSE /* not connected */);

    CURL_TRC_FTP(data, "[%s] DO phase is complete2", FTP_DSTATE(data));
  }
  return result;
}